

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * FixPath_abi_cxx11_(CStringRef path,char sep)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char in_DL;
  string *in_RDI;
  string *fixed;
  char *in_stack_ffffffffffffff98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_13;
  undefined1 local_12;
  char local_11;
  BasicCStringRef<char> local_10 [2];
  
  local_12 = 0;
  __last._M_current = (char *)in_RDI;
  local_11 = in_DL;
  __first._M_current = fmt::BasicCStringRef<char>::c_str(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator(&local_13);
  if (local_11 != '/') {
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,(char *)in_RDI,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

std::string FixPath(fmt::CStringRef path, char sep) {
  std::string fixed(path.c_str());
  if (sep != '/')
    std::replace(fixed.begin(), fixed.end(), '/', sep);
  return fixed;
}